

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O3

int mem_truncate(int handle,LONGLONG filesize)

{
  ulong uVar1;
  char *pcVar2;
  
  if (memTable[handle].mem_realloc != (_func_void_ptr_void_ptr_size_t *)0x0) {
    pcVar2 = (char *)(*memTable[handle].mem_realloc)(*memTable[handle].memaddrptr,filesize);
    if (pcVar2 == (char *)0x0) {
      ffpmsg("Failed to reallocate memory (mem_truncate)");
      return 0x71;
    }
    uVar1 = *memTable[handle].memsizeptr;
    if (uVar1 <= (ulong)filesize && filesize - uVar1 != 0) {
      memset(pcVar2 + uVar1,0,filesize - uVar1);
    }
    *memTable[handle].memaddrptr = pcVar2;
    *memTable[handle].memsizeptr = filesize;
  }
  memTable[handle].currentpos = filesize;
  memTable[handle].fitsfilesize = filesize;
  return 0;
}

Assistant:

int mem_truncate(int handle, LONGLONG filesize)
/*
  truncate the file to a new size
*/
{
    char *ptr;

    /* call the memory reallocation function, if defined */
    if ( memTable[handle].mem_realloc )
    {    /* explicit LONGLONG->size_t cast */
        ptr = (memTable[handle].mem_realloc)(
                                *(memTable[handle].memaddrptr),
                                 (size_t) filesize);
        if (!ptr)
        {
            ffpmsg("Failed to reallocate memory (mem_truncate)");
            return(MEMORY_ALLOCATION);
        }

        /* if allocated more memory, initialize it to zero */
        if ( filesize > *(memTable[handle].memsizeptr) )
        {
             memset(ptr + *(memTable[handle].memsizeptr),
                    0,
                ((size_t) filesize) - *(memTable[handle].memsizeptr) );
        }

        *(memTable[handle].memaddrptr) = ptr;
        *(memTable[handle].memsizeptr) = (size_t) (filesize);
    }

    memTable[handle].currentpos = filesize;
    memTable[handle].fitsfilesize = filesize;
    return(0);
}